

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_bench_sqlite3.cc
# Opt level: O2

void __thiscall leveldb::Benchmark::Run(Benchmark *this)

{
  FILE *__stream;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  DBState state;
  DBState order;
  int value_size;
  char *pcVar4;
  int entries_per_batch;
  string local_60;
  Slice local_40;
  
  PrintHeader(this);
  Open(this);
  pcVar4 = FLAGS_benchmarks;
  do {
    while( true ) {
      if (pcVar4 == (char *)0x0) {
        return;
      }
      pcVar3 = strchr(pcVar4,0x2c);
      local_40.data_ = "";
      local_40.size_ = 0;
      if (pcVar3 == (char *)0x0) {
        local_40.size_ = strlen(pcVar4);
        pcVar3 = (char *)0x0;
      }
      else {
        local_40.size_ = (long)pcVar3 - (long)pcVar4;
        pcVar3 = pcVar3 + 1;
      }
      this->bytes_ = 0;
      local_40.data_ = pcVar4;
      Start(this);
      local_60._M_dataplus._M_p = "fillseq";
      local_60._M_string_length = 7;
      bVar1 = operator==(&local_40,(Slice *)&local_60);
      pcVar4 = pcVar3;
      if (!bVar1) break;
      iVar2 = this->num_;
      entries_per_batch = 1;
LAB_001056aa:
      order = FRESH;
LAB_001056b1:
      bVar1 = false;
      value_size = FLAGS_value_size;
      state = FRESH;
LAB_001056b3:
      Write(this,bVar1,order,state,iVar2,value_size,entries_per_batch);
      WalCheckpoint(this->db_);
LAB_001056c0:
      Stop(this,&local_40);
    }
    local_60._M_dataplus._M_p = "fillseqbatch";
    local_60._M_string_length = 0xc;
    bVar1 = operator==(&local_40,(Slice *)&local_60);
    if (bVar1) {
      iVar2 = this->num_;
      entries_per_batch = 1000;
      goto LAB_001056aa;
    }
    local_60._M_dataplus._M_p = "fillrandom";
    local_60._M_string_length = 10;
    bVar1 = operator==(&local_40,(Slice *)&local_60);
    if (bVar1) {
      iVar2 = this->num_;
      entries_per_batch = 1;
LAB_00105741:
      order = EXISTING;
      goto LAB_001056b1;
    }
    local_60._M_dataplus._M_p = "fillrandbatch";
    local_60._M_string_length = 0xd;
    bVar1 = operator==(&local_40,(Slice *)&local_60);
    if (bVar1) {
      iVar2 = this->num_;
      entries_per_batch = 1000;
      goto LAB_00105741;
    }
    local_60._M_dataplus._M_p = "overwrite";
    local_60._M_string_length = 9;
    bVar1 = operator==(&local_40,(Slice *)&local_60);
    if (bVar1) {
      iVar2 = this->num_;
      entries_per_batch = 1;
LAB_001057bc:
      bVar1 = false;
      order = EXISTING;
      value_size = FLAGS_value_size;
      state = order;
      goto LAB_001056b3;
    }
    local_60._M_dataplus._M_p = "overwritebatch";
    local_60._M_string_length = 0xe;
    bVar1 = operator==(&local_40,(Slice *)&local_60);
    if (bVar1) {
      iVar2 = this->num_;
      entries_per_batch = 1000;
      goto LAB_001057bc;
    }
    local_60._M_dataplus._M_p = "fillrandsync";
    local_60._M_string_length = 0xc;
    bVar1 = operator==(&local_40,(Slice *)&local_60);
    if (bVar1) {
      iVar2 = this->num_;
      order = EXISTING;
LAB_00105853:
      iVar2 = iVar2 / 100;
      bVar1 = true;
      entries_per_batch = 1;
      state = FRESH;
      value_size = FLAGS_value_size;
      goto LAB_001056b3;
    }
    local_60._M_dataplus._M_p = "fillseqsync";
    local_60._M_string_length = 0xb;
    bVar1 = operator==(&local_40,(Slice *)&local_60);
    if (bVar1) {
      iVar2 = this->num_;
      order = FRESH;
      goto LAB_00105853;
    }
    local_60._M_dataplus._M_p = "fillrand100K";
    local_60._M_string_length = 0xc;
    bVar1 = operator==(&local_40,(Slice *)&local_60);
    if (bVar1) {
      iVar2 = this->num_;
      order = EXISTING;
LAB_001058da:
      entries_per_batch = 1;
      iVar2 = iVar2 / 1000;
      bVar1 = false;
      state = FRESH;
      value_size = 100000;
      goto LAB_001056b3;
    }
    local_60._M_dataplus._M_p = "fillseq100K";
    local_60._M_string_length = 0xb;
    bVar1 = operator==(&local_40,(Slice *)&local_60);
    if (bVar1) {
      iVar2 = this->num_;
      order = FRESH;
      goto LAB_001058da;
    }
    local_60._M_dataplus._M_p = "readseq";
    local_60._M_string_length = 7;
    bVar1 = operator==(&local_40,(Slice *)&local_60);
    if (bVar1) {
      ReadSequential(this);
      goto LAB_001056c0;
    }
    local_60._M_dataplus._M_p = "readrandom";
    local_60._M_string_length = 10;
    bVar1 = operator==(&local_40,(Slice *)&local_60);
    if (bVar1) {
      Read(this,RANDOM,1);
      goto LAB_001056c0;
    }
    local_60._M_dataplus._M_p = "readrand100K";
    local_60._M_string_length = 0xc;
    bVar1 = operator==(&local_40,(Slice *)&local_60);
    if (bVar1) {
      iVar2 = this->reads_;
      this->reads_ = iVar2 / 1000;
      Read(this,RANDOM,1);
      this->reads_ = iVar2;
      goto LAB_001056c0;
    }
    local_60._M_dataplus._M_p = "";
    local_60._M_string_length = 0;
    bVar1 = operator!=(&local_40,(Slice *)&local_60);
    __stream = _stderr;
    if (bVar1) {
      Slice::ToString_abi_cxx11_(&local_60,&local_40);
      fprintf(__stream,"unknown benchmark \'%s\'\n",local_60._M_dataplus._M_p);
      std::__cxx11::string::_M_dispose();
    }
  } while( true );
}

Assistant:

void Run() {
    PrintHeader();
    Open();

    const char* benchmarks = FLAGS_benchmarks;
    while (benchmarks != nullptr) {
      const char* sep = strchr(benchmarks, ',');
      Slice name;
      if (sep == nullptr) {
        name = benchmarks;
        benchmarks = nullptr;
      } else {
        name = Slice(benchmarks, sep - benchmarks);
        benchmarks = sep + 1;
      }

      bytes_ = 0;
      Start();

      bool known = true;
      bool write_sync = false;
      if (name == Slice("fillseq")) {
        Write(write_sync, SEQUENTIAL, FRESH, num_, FLAGS_value_size, 1);
        WalCheckpoint(db_);
      } else if (name == Slice("fillseqbatch")) {
        Write(write_sync, SEQUENTIAL, FRESH, num_, FLAGS_value_size, 1000);
        WalCheckpoint(db_);
      } else if (name == Slice("fillrandom")) {
        Write(write_sync, RANDOM, FRESH, num_, FLAGS_value_size, 1);
        WalCheckpoint(db_);
      } else if (name == Slice("fillrandbatch")) {
        Write(write_sync, RANDOM, FRESH, num_, FLAGS_value_size, 1000);
        WalCheckpoint(db_);
      } else if (name == Slice("overwrite")) {
        Write(write_sync, RANDOM, EXISTING, num_, FLAGS_value_size, 1);
        WalCheckpoint(db_);
      } else if (name == Slice("overwritebatch")) {
        Write(write_sync, RANDOM, EXISTING, num_, FLAGS_value_size, 1000);
        WalCheckpoint(db_);
      } else if (name == Slice("fillrandsync")) {
        write_sync = true;
        Write(write_sync, RANDOM, FRESH, num_ / 100, FLAGS_value_size, 1);
        WalCheckpoint(db_);
      } else if (name == Slice("fillseqsync")) {
        write_sync = true;
        Write(write_sync, SEQUENTIAL, FRESH, num_ / 100, FLAGS_value_size, 1);
        WalCheckpoint(db_);
      } else if (name == Slice("fillrand100K")) {
        Write(write_sync, RANDOM, FRESH, num_ / 1000, 100 * 1000, 1);
        WalCheckpoint(db_);
      } else if (name == Slice("fillseq100K")) {
        Write(write_sync, SEQUENTIAL, FRESH, num_ / 1000, 100 * 1000, 1);
        WalCheckpoint(db_);
      } else if (name == Slice("readseq")) {
        ReadSequential();
      } else if (name == Slice("readrandom")) {
        Read(RANDOM, 1);
      } else if (name == Slice("readrand100K")) {
        int n = reads_;
        reads_ /= 1000;
        Read(RANDOM, 1);
        reads_ = n;
      } else {
        known = false;
        if (name != Slice()) {  // No error message for empty name
          std::fprintf(stderr, "unknown benchmark '%s'\n",
                       name.ToString().c_str());
        }
      }
      if (known) {
        Stop(name);
      }
    }
  }